

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O0

CURLMcode singlesocket(Curl_multi *multi,Curl_easy *data)

{
  curl_socket_t s_00;
  int s_01;
  uint uVar1;
  Curl_sh_entry *list;
  byte bVar2;
  bool bVar3;
  int oldactions;
  _Bool stillused;
  int j;
  uint uStack_70;
  _Bool sincebefore;
  uint comboaction;
  uint prevaction;
  uint action;
  int actions [5];
  uint curraction;
  int num;
  curl_socket_t s;
  Curl_sh_entry *entry;
  curl_socket_t local_38;
  int i;
  curl_socket_t socks [5];
  Curl_easy *data_local;
  Curl_multi *multi_local;
  
  for (entry._4_4_ = 0; entry._4_4_ < 5; entry._4_4_ = entry._4_4_ + 1) {
    (&local_38)[entry._4_4_] = -1;
  }
  unique0x1000046d = data;
  actions[3] = multi_getsock(data,&local_38,5);
  entry._4_4_ = 0;
  do {
    bVar3 = false;
    bVar2 = (byte)entry._4_4_;
    if (entry._4_4_ < 5) {
      bVar3 = (actions[3] & (1 << (bVar2 & 0x1f) | 1 << (bVar2 + 0x10 & 0x1f))) != 0;
    }
    if (!bVar3) {
      actions[4] = entry._4_4_;
      entry._4_4_ = 0;
      do {
        if (stack0xffffffffffffffe0->numsocks <= entry._4_4_) {
          memcpy(stack0xffffffffffffffe0->sockets,&local_38,(long)actions[4] << 2);
          memcpy(stack0xffffffffffffffe0->actions,&prevaction,(long)actions[4] << 2);
          stack0xffffffffffffffe0->numsocks = actions[4];
          return CURLM_OK;
        }
        bVar3 = false;
        s_01 = stack0xffffffffffffffe0->sockets[entry._4_4_];
        for (oldactions = 0; oldactions < actions[4]; oldactions = oldactions + 1) {
          if (s_01 == (&local_38)[oldactions]) {
            bVar3 = true;
            break;
          }
        }
        if ((!bVar3) && (list = sh_getentry(&multi->sockhash,s_01), list != (Curl_sh_entry *)0x0)) {
          uVar1 = stack0xffffffffffffffe0->actions[entry._4_4_];
          list->users = list->users - 1;
          if ((uVar1 & 2) != 0) {
            list->writers = list->writers - 1;
          }
          if ((uVar1 & 1) != 0) {
            list->readers = list->readers - 1;
          }
          if (list->users == 0) {
            if (multi->socket_cb != (curl_socket_callback)0x0) {
              (*multi->socket_cb)(stack0xffffffffffffffe0,s_01,4,multi->socket_userp,list->socketp);
            }
            sh_delentry(&multi->sockhash,s_01);
          }
          else {
            Curl_llist_remove(&list->list,&stack0xffffffffffffffe0->sh_queue,(void *)0x0);
          }
        }
        entry._4_4_ = entry._4_4_ + 1;
      } while( true );
    }
    uStack_70 = 0;
    bVar3 = false;
    s_00 = (&local_38)[entry._4_4_];
    _num = sh_getentry(&multi->sockhash,s_00);
    comboaction = (uint)((actions[3] & 1 << (bVar2 & 0x1f)) != 0);
    if ((actions[3] & 1 << (bVar2 + 0x10 & 0x1f)) != 0) {
      comboaction = comboaction | 2;
    }
    (&prevaction)[entry._4_4_] = comboaction;
    if (_num == (Curl_sh_entry *)0x0) {
      _num = sh_addentry(&multi->sockhash,s_00);
      if (_num == (Curl_sh_entry *)0x0) {
        return CURLM_OUT_OF_MEMORY;
      }
    }
    else {
      for (entry._4_4_ = 0; entry._4_4_ < stack0xffffffffffffffe0->numsocks;
          entry._4_4_ = entry._4_4_ + 1) {
        if (s_00 == stack0xffffffffffffffe0->sockets[entry._4_4_]) {
          uStack_70 = stack0xffffffffffffffe0->actions[entry._4_4_];
          bVar3 = true;
          break;
        }
      }
    }
    if ((bVar3) && (uStack_70 != comboaction)) {
      if ((uStack_70 & 1) != 0) {
        _num->readers = _num->readers - 1;
      }
      if ((uStack_70 & 2) != 0) {
        _num->writers = _num->writers - 1;
      }
      if ((comboaction & 1) != 0) {
        _num->readers = _num->readers + 1;
      }
      if ((comboaction & 2) != 0) {
        _num->writers = _num->writers + 1;
      }
    }
    else if (!bVar3) {
      _num->users = _num->users + 1;
      if ((comboaction & 1) != 0) {
        _num->readers = _num->readers + 1;
      }
      if ((comboaction & 2) != 0) {
        _num->writers = _num->writers + 1;
      }
      Curl_llist_insert_next
                (&_num->list,(_num->list).tail,stack0xffffffffffffffe0,
                 &stack0xffffffffffffffe0->sh_queue);
    }
    uVar1 = 0;
    if (_num->writers != 0) {
      uVar1 = 2;
    }
    uVar1 = uVar1 | _num->readers != 0;
    if (_num->action != uVar1) {
      if (multi->socket_cb != (curl_socket_callback)0x0) {
        (*multi->socket_cb)(stack0xffffffffffffffe0,s_00,uVar1,multi->socket_userp,_num->socketp);
      }
      _num->action = uVar1;
    }
    entry._4_4_ = entry._4_4_ + 1;
  } while( true );
}

Assistant:

static CURLMcode singlesocket(struct Curl_multi *multi,
                              struct Curl_easy *data)
{
  curl_socket_t socks[MAX_SOCKSPEREASYHANDLE];
  int i;
  struct Curl_sh_entry *entry;
  curl_socket_t s;
  int num;
  unsigned int curraction;
  int actions[MAX_SOCKSPEREASYHANDLE];

  for(i = 0; i< MAX_SOCKSPEREASYHANDLE; i++)
    socks[i] = CURL_SOCKET_BAD;

  /* Fill in the 'current' struct with the state as it is now: what sockets to
     supervise and for what actions */
  curraction = multi_getsock(data, socks, MAX_SOCKSPEREASYHANDLE);

  /* We have 0 .. N sockets already and we get to know about the 0 .. M
     sockets we should have from now on. Detect the differences, remove no
     longer supervised ones and add new ones */

  /* walk over the sockets we got right now */
  for(i = 0; (i< MAX_SOCKSPEREASYHANDLE) &&
        (curraction & (GETSOCK_READSOCK(i) | GETSOCK_WRITESOCK(i)));
      i++) {
    unsigned int action = CURL_POLL_NONE;
    unsigned int prevaction = 0;
    unsigned int comboaction;
    bool sincebefore = FALSE;

    s = socks[i];

    /* get it from the hash */
    entry = sh_getentry(&multi->sockhash, s);

    if(curraction & GETSOCK_READSOCK(i))
      action |= CURL_POLL_IN;
    if(curraction & GETSOCK_WRITESOCK(i))
      action |= CURL_POLL_OUT;

    actions[i] = action;
    if(entry) {
      /* check if new for this transfer */
      for(i = 0; i< data->numsocks; i++) {
        if(s == data->sockets[i]) {
          prevaction = data->actions[i];
          sincebefore = TRUE;
          break;
        }
      }

    }
    else {
      /* this is a socket we didn't have before, add it to the hash! */
      entry = sh_addentry(&multi->sockhash, s);
      if(!entry)
        /* fatal */
        return CURLM_OUT_OF_MEMORY;
    }
    if(sincebefore && (prevaction != action)) {
      /* Socket was used already, but different action now */
      if(prevaction & CURL_POLL_IN)
        entry->readers--;
      if(prevaction & CURL_POLL_OUT)
        entry->writers--;
      if(action & CURL_POLL_IN)
        entry->readers++;
      if(action & CURL_POLL_OUT)
        entry->writers++;
    }
    else if(!sincebefore) {
      /* a new user */
      entry->users++;
      if(action & CURL_POLL_IN)
        entry->readers++;
      if(action & CURL_POLL_OUT)
        entry->writers++;

      /* add 'data' to the list of handles using this socket! */
      Curl_llist_insert_next(&entry->list, entry->list.tail,
                             data, &data->sh_queue);
    }

    comboaction = (entry->writers? CURL_POLL_OUT : 0) |
      (entry->readers ? CURL_POLL_IN : 0);

#if 0
    infof(data, "--- Comboaction: %u readers %u writers\n",
          entry->readers, entry->writers);
#endif
    /* check if it has the same action set */
    if(entry->action == comboaction)
      /* same, continue */
      continue;

    /* we know (entry != NULL) at this point, see the logic above */
    if(multi->socket_cb)
      multi->socket_cb(data,
                       s,
                       comboaction,
                       multi->socket_userp,
                       entry->socketp);

    entry->action = comboaction; /* store the current action state */
  }

  num = i; /* number of sockets */

  /* when we've walked over all the sockets we should have right now, we must
     make sure to detect sockets that are removed */
  for(i = 0; i< data->numsocks; i++) {
    int j;
    bool stillused = FALSE;
    s = data->sockets[i];
    for(j = 0; j < num; j++) {
      if(s == socks[j]) {
        /* this is still supervised */
        stillused = TRUE;
        break;
      }
    }
    if(stillused)
      continue;

    entry = sh_getentry(&multi->sockhash, s);
    /* if this is NULL here, the socket has been closed and notified so
       already by Curl_multi_closed() */
    if(entry) {
      int oldactions = data->actions[i];
      /* this socket has been removed. Decrease user count */
      entry->users--;
      if(oldactions & CURL_POLL_OUT)
        entry->writers--;
      if(oldactions & CURL_POLL_IN)
        entry->readers--;
      if(!entry->users) {
        if(multi->socket_cb)
          multi->socket_cb(data, s, CURL_POLL_REMOVE,
                           multi->socket_userp,
                           entry->socketp);
        sh_delentry(&multi->sockhash, s);
      }
      else {
        /* remove this transfer as a user of this socket */
        Curl_llist_remove(&entry->list, &data->sh_queue, NULL);
      }
    }
  } /* for loop over numsocks */

  memcpy(data->sockets, socks, num*sizeof(curl_socket_t));
  memcpy(data->actions, actions, num*sizeof(int));
  data->numsocks = num;
  return CURLM_OK;
}